

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

void __thiscall deqp::egl::GLES2ThreadTest::DestroyContext::exec(DestroyContext *this,Thread *t)

{
  _func_int **pp_Var1;
  GLES2Context *pGVar2;
  deUint32 err;
  Thread *pTVar3;
  MessageBuilder *pMVar4;
  undefined1 local_1b0 [400];
  
  pTVar3 = (Thread *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0);
  if (pTVar3 != (Thread *)0x0) {
    local_1b0._0_8_ = pTVar3;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 0x18),"Begin -- eglDestroyContext(");
    pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1b0,&((this->m_context).m_ptr)->display);
    std::operator<<((ostream *)&pMVar4->field_0x18,", ");
    pMVar4 = tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,&((this->m_context).m_ptr)->context)
    ;
    std::operator<<((ostream *)&pMVar4->field_0x18,")");
    tcu::ThreadUtil::MessageBuilder::operator<<(pMVar4,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
    pp_Var1 = pTVar3[1].super_Thread._vptr_Thread;
    pGVar2 = (this->m_context).m_ptr;
    (**(code **)(*pp_Var1 + 0x98))(pp_Var1,pGVar2->display,pGVar2->context);
    err = (**(code **)(*pTVar3[1].super_Thread._vptr_Thread + 0xf8))();
    eglu::checkError(err,"destroyContext(m_context->display, m_context->context)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                     ,0x28f);
    local_1b0._0_8_ = pTVar3;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 0x18),"End -- eglDestroyContext()");
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
    pGVar2 = (this->m_context).m_ptr;
    pGVar2->display = (EGLDisplay)0x0;
    pGVar2->context = (EGLContext)0x0;
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void DestroyContext::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);

	thread.newMessage() << "Begin -- eglDestroyContext(" << m_context->display << ", " << m_context->context << ")" << tcu::ThreadUtil::Message::End;
	EGLU_CHECK_CALL(thread.egl, destroyContext(m_context->display, m_context->context));
	thread.newMessage() << "End -- eglDestroyContext()" << tcu::ThreadUtil::Message::End;
	m_context->display	= EGL_NO_DISPLAY;
	m_context->context	= EGL_NO_CONTEXT;
}